

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

bool ImPlot::BeginDragDropSourceEx
               (ImGuiID source_id,bool is_hovered,ImGuiDragDropFlags flags,ImGuiKeyModFlags key_mods
               )

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *tooltip_window;
  ImGuiPayload *payload;
  ImGuiMouseButton mouse_button;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiKeyModFlags key_mods_local;
  ImGuiDragDropFlags flags_local;
  bool is_hovered_local;
  ImGuiID source_id_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (((GImGui->IO).MouseDown[0] & 1U) == 0) {
    if (GImGui->ActiveId == source_id) {
      ImGui::ClearActiveID();
    }
    is_hovered_local = false;
  }
  else {
    if (((is_hovered) && (((GImGui->IO).MouseClicked[0] & 1U) != 0)) &&
       ((GImGui->IO).KeyMods == key_mods)) {
      ImGui::SetActiveID(source_id,pIVar1);
      ImGui::FocusWindow(pIVar1);
    }
    if (pIVar2->ActiveId == source_id) {
      pIVar2->ActiveIdAllowOverlap = is_hovered;
      pIVar2->ActiveIdUsingNavDirMask = 0xffffffff;
      pIVar2->ActiveIdUsingNavInputMask = 0xffffffff;
      pIVar2->ActiveIdUsingKeyInputMask = 0xffffffffffffffff;
      bVar3 = ImGui::IsMouseDragging(0,-1.0);
      if (bVar3) {
        if ((pIVar2->DragDropActive & 1U) == 0) {
          ImGui::ClearDragDrop();
          (pIVar2->DragDropPayload).SourceId = source_id;
          (pIVar2->DragDropPayload).SourceParentId = 0;
          pIVar2->DragDropActive = true;
          pIVar2->DragDropSourceFlags = 0;
          pIVar2->DragDropMouseButton = 0;
        }
        pIVar2->DragDropSourceFrameCount = pIVar2->FrameCount;
        pIVar2->DragDropWithinSource = true;
        if ((((flags & 1U) == 0) && (ImGui::BeginTooltip(), pIVar2->DragDropAcceptIdPrev != 0)) &&
           ((pIVar2->DragDropAcceptFlags & 0x1000U) != 0)) {
          pIVar1 = pIVar2->CurrentWindow;
          pIVar1->SkipItems = true;
          pIVar1->HiddenFramesCanSkipItems = '\x01';
        }
        is_hovered_local = true;
      }
      else {
        is_hovered_local = false;
      }
    }
    else {
      is_hovered_local = false;
    }
  }
  return is_hovered_local;
}

Assistant:

bool BeginDragDropSourceEx(ImGuiID source_id, bool is_hovered, ImGuiDragDropFlags flags, ImGuiKeyModFlags key_mods) {
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiMouseButton mouse_button = ImGuiMouseButton_Left;

    if (g.IO.MouseDown[mouse_button] == false) {
        if (g.ActiveId == source_id)
            ImGui::ClearActiveID();
        return false;
    }

    if (is_hovered && g.IO.MouseClicked[mouse_button] && g.IO.KeyMods == key_mods) {
        ImGui::SetActiveID(source_id, window);
        ImGui::FocusWindow(window);
    }

    if (g.ActiveId != source_id) {
        return false;
    }

    g.ActiveIdAllowOverlap = is_hovered;
    g.ActiveIdUsingNavDirMask = ~(ImU32)0;
    g.ActiveIdUsingNavInputMask = ~(ImU32)0;
    g.ActiveIdUsingKeyInputMask = ~(ImU64)0;

    if (ImGui::IsMouseDragging(mouse_button)) {

        if (!g.DragDropActive) {
            ImGui::ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = 0;
            g.DragDropActive = true;
            g.DragDropSourceFlags = 0;
            g.DragDropMouseButton = mouse_button;
        }
        g.DragDropSourceFrameCount = g.FrameCount;
        g.DragDropWithinSource = true;

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip)) {
            ImGui::BeginTooltip();
            if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip)) {
                ImGuiWindow* tooltip_window = g.CurrentWindow;
                tooltip_window->SkipItems = true;
                tooltip_window->HiddenFramesCanSkipItems = 1;
            }
        }
        return true;
    }
    return false;
}